

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  uint uVar1;
  int iVar2;
  int32_t iVar3;
  ImGuiIO *pIVar4;
  ImGuiStyle *pIVar5;
  long lVar6;
  long *plVar7;
  _Base_ptr p_Var8;
  ImDrawData *drawData;
  ulong uVar9;
  int *piVar10;
  long *plVar11;
  Event *event;
  long lVar12;
  Event *event_00;
  _Base_ptr *pp_Var13;
  Event *pEVar14;
  double dVar15;
  undefined1 auVar16 [16];
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ImGuiWS imguiWS;
  int height;
  string httpRoot;
  State state;
  int width;
  ImGuiWS local_1f8;
  Event *local_1f0;
  _Map_pointer local_1e8;
  timespec local_1e0;
  long local_1d0;
  long lStack_1c8;
  _Map_pointer local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  undefined1 local_100 [32];
  _Rb_tree_node_base local_e0;
  unsigned_long local_c0;
  deque<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_> local_80;
  
  printf("Usage: %s [port] [http-root]\n",*argv);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"../examples","");
  uVar1 = 5000;
  if (1 < argc) {
    uVar1 = atoi(argv[1]);
  }
  if (2 < argc) {
    __s = argv[2];
    strlen(__s);
    std::__cxx11::string::_M_replace
              ((ulong)&local_138,0,(char *)local_138._M_string_length,(ulong)__s);
  }
  ImGui::DebugCheckVersionAndDataLayout("1.88 WIP",0x37d0,0x418,8,0x10,0x14,2);
  ImGui::CreateContext((ImFontAtlas *)0x0);
  pIVar4 = ImGui::GetIO();
  pIVar4->MouseDrawCursor = true;
  ImGui::StyleColorsDark((ImGuiStyle *)0x0);
  pIVar5 = ImGui::GetStyle();
  pIVar5->AntiAliasedFill = false;
  pIVar5 = ImGui::GetStyle();
  pIVar5->AntiAliasedLines = false;
  pIVar5 = ImGui::GetStyle();
  pIVar5->WindowRounding = 0.0;
  pIVar5 = ImGui::GetStyle();
  pIVar5->ScrollbarRounding = 0.0;
  ImGuiWS::ImGuiWS(&local_1f8);
  std::operator+(&local_158,&local_138,"/demo-null");
  local_100._0_8_ = local_100 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"");
  pp_Var13 = &local_e0._M_left;
  local_e0._0_8_ = pp_Var13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"index.html","");
  __l._M_len = 2;
  __l._M_array = (iterator)local_100;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_118,__l,(allocator_type *)&local_80);
  ImGuiWS::init(&local_1f8,(EVP_PKEY_CTX *)(ulong)uVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118);
  lVar12 = -0x40;
  do {
    if (pp_Var13 != (_Base_ptr *)*(long **)(pp_Var13 + -2)) {
      operator_delete(*(long **)(pp_Var13 + -2),(ulong)((long)&(*pp_Var13)->_M_color + 1));
    }
    pp_Var13 = pp_Var13 + -4;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  pIVar4 = ImGui::GetIO();
  ImFontAtlas::GetTexDataAsAlpha8
            (pIVar4->Fonts,(uchar **)local_100,(int *)&local_80,(int *)&local_1e0,(int *)0x0);
  ImGuiWS::setTexture(&local_1f8,0,Alpha8,
                      (int32_t)local_80.
                               super__Deque_base<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_>.
                               _M_impl.super__Deque_impl_data._M_map,(int32_t)local_1e0.tv_sec,
                      (char *)local_100._0_8_);
  lVar12 = std::chrono::_V2::system_clock::now();
  State::State((State *)local_100);
  lVar6 = -(lVar12 >> 0x3f);
  lVar12 = lVar12 / 1000 + (lVar12 >> 0x3f);
  local_1c0 = (_Map_pointer)(lVar12 + lVar6);
  lVar12 = lVar12 + lVar6 + 0x411a;
  do {
    ImGuiWS::takeEvents(&local_80,&local_1f8);
    local_1f0 = local_80.super__Deque_base<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur;
    if (local_80.super__Deque_base<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur !=
        local_80.super__Deque_base<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur) {
      local_1e8 = local_80.super__Deque_base<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_node;
      event_00 = local_80.super__Deque_base<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_>._M_impl
                 .super__Deque_impl_data._M_start._M_cur;
      pEVar14 = local_80.super__Deque_base<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_>._M_impl.
                super__Deque_impl_data._M_start._M_last;
      do {
        State::handle((State *)local_100,event_00);
        event_00 = event_00 + 1;
        if (event_00 == pEVar14) {
          event_00 = local_1e8[1];
          local_1e8 = local_1e8 + 1;
          pEVar14 = event_00 + 7;
        }
      } while (event_00 != local_1f0);
    }
    State::update((State *)local_100);
    pIVar4 = ImGui::GetIO();
    (pIVar4->DisplaySize).x = 1200.0;
    (pIVar4->DisplaySize).y = 800.0;
    lVar6 = std::chrono::_V2::system_clock::now();
    local_1e8 = (_Map_pointer)(lVar6 / 1000);
    pIVar4->DeltaTime = (float)(ulong)((long)local_1e8 - (long)local_1c0) / 1e+06;
    ImGui::NewFrame();
    if (local_100[0] == (string)0x1) {
      ImGui::ShowDemoWindow((bool *)local_100);
    }
    ImGui::Begin("Hello, world!",(bool *)0x0,0);
    ImGui::Checkbox("Demo Window",(bool *)local_100);
    pIVar4 = ImGui::GetIO();
    local_1f0 = (Event *)CONCAT44(local_1f0._4_4_,pIVar4->Framerate);
    pIVar4 = ImGui::GetIO();
    ImGui::Text("Application average %.3f ms/frame (%.1f FPS)",(double)(1000.0 / local_1f0._0_4_),
                (double)pIVar4->Framerate);
    ImGui::End();
    local_1e0.tv_sec = 0x4120000041200000;
    local_198._M_dataplus._M_p = (pointer)0x0;
    ImGui::SetNextWindowPos((ImVec2 *)&local_1e0,1,(ImVec2 *)&local_198);
    local_1e0.tv_sec = 0x4396000043c80000;
    ImGui::SetNextWindowSize((ImVec2 *)&local_1e0,1);
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"WebSocket clients (","");
    std::__cxx11::to_string(&local_178,local_c0);
    std::operator+(&local_198,&local_1b8,&local_178);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_198);
    local_1e0.tv_sec = (__time_t)&local_1d0;
    plVar11 = plVar7 + 2;
    if ((long *)*plVar7 == plVar11) {
      local_1d0 = *plVar11;
      lStack_1c8 = plVar7[3];
    }
    else {
      local_1d0 = *plVar11;
      local_1e0.tv_sec = (__time_t)*plVar7;
    }
    local_1e0.tv_nsec = plVar7[1];
    *plVar7 = (long)plVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    ImGui::Begin((char *)local_1e0.tv_sec,(bool *)0x0,0x20);
    if ((long *)local_1e0.tv_sec != &local_1d0) {
      operator_delete((void *)local_1e0.tv_sec,local_1d0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    ImGui::Text(" Id   Ip addr");
    for (p_Var8 = local_e0._M_left; p_Var8 != &local_e0;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      ImGui::Text("%3d : %s",(ulong)p_Var8[1]._M_color,p_Var8[1]._M_left);
      if (*(char *)&p_Var8[1]._M_parent == '\x01') {
        ImGui::SameLine(0.0,-1.0);
        local_1f0 = (Event *)CONCAT44(local_1f0._4_4_,local_100._8_4_);
        dVar15 = ImGui::GetTime();
        ImGui::TextDisabled(" [has control for %4.2f seconds]",(double)local_1f0._0_4_ - dVar15);
      }
    }
    ImGui::End();
    ImGui::Render();
    drawData = ImGui::GetDrawData();
    ImGuiWS::setDrawData(&local_1f8,drawData);
    do {
      lVar6 = std::chrono::_V2::system_clock::now();
      while ((ulong)(lVar6 / 1000) < lVar12 - 100U) {
        lVar6 = lVar12 - lVar6 / 1000;
        auVar16._8_4_ = (int)((ulong)lVar6 >> 0x20);
        auVar16._0_8_ = lVar6;
        auVar16._12_4_ = 0x45300000;
        dVar15 = ((auVar16._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) * 0.9;
        uVar9 = (ulong)dVar15;
        uVar9 = (long)(dVar15 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9;
        if (0 < (long)uVar9) {
          local_1e0.tv_sec = uVar9 / 1000000;
          local_1e0.tv_nsec = (uVar9 % 1000000) * 1000;
          do {
            iVar2 = nanosleep(&local_1e0,&local_1e0);
            if (iVar2 != -1) break;
            piVar10 = __errno_location();
          } while (*piVar10 == 4);
        }
        lVar6 = std::chrono::_V2::system_clock::now();
      }
      iVar3 = ImGuiWS::nConnected(&local_1f8);
      lVar12 = lVar12 + 0x411a;
    } while (iVar3 == 0);
    std::deque<ImGuiWS::Event,_std::allocator<ImGuiWS::Event>_>::~deque(&local_80);
    local_1c0 = local_1e8;
  } while( true );
}

Assistant:

int main(int argc, char ** argv) {
    printf("Usage: %s [port] [http-root]\n", argv[0]);

    int port = 5000;
    std::string httpRoot = "../examples";

    if (argc > 1) port = atoi(argv[1]);
    if (argc > 2) httpRoot = argv[2];

    IMGUI_CHECKVERSION();
    ImGui::CreateContext();
    ImGui::GetIO().MouseDrawCursor = true;

    ImGui::StyleColorsDark();
    ImGui::GetStyle().AntiAliasedFill = false;
    ImGui::GetStyle().AntiAliasedLines = false;
    ImGui::GetStyle().WindowRounding = 0.0f;
    ImGui::GetStyle().ScrollbarRounding = 0.0f;

    // setup imgui-ws
    ImGuiWS imguiWS;
    imguiWS.init(port, httpRoot + "/demo-null", { "", "index.html" });

    // prepare font texture
    {
        unsigned char * pixels;
        int width, height;
        ImGui::GetIO().Fonts->GetTexDataAsAlpha8(&pixels, &width, &height);
        imguiWS.setTexture(0, ImGuiWS::Texture::Type::Alpha8, width, height, (const char *) pixels);
    }

    VSync vsync;
    State state;

    while (true) {
        // websocket event handling
        auto events = imguiWS.takeEvents();
        for (auto & event : events) {
            state.handle(std::move(event));
        }
        state.update();

        {
            auto & io = ImGui::GetIO();
            io.DisplaySize = ImVec2(1200, 800);
            io.DeltaTime = vsync.delta_s();
        }

        ImGui::NewFrame();

        // render stuff
        if (state.showDemoWindow) {
            ImGui::ShowDemoWindow(&state.showDemoWindow);
        }

        // debug window
        {
            ImGui::Begin("Hello, world!");
            ImGui::Checkbox("Demo Window", &state.showDemoWindow);
            ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / ImGui::GetIO().Framerate, ImGui::GetIO().Framerate);
            ImGui::End();
        }

        // show connected clients
        ImGui::SetNextWindowPos({ 10, 10 } , ImGuiCond_Always);
        ImGui::SetNextWindowSize({ 400, 300 } , ImGuiCond_Always);
        ImGui::Begin((std::string("WebSocket clients (") + std::to_string(state.clients.size()) + ")").c_str(), nullptr, ImGuiWindowFlags_NoCollapse);
        ImGui::Text(" Id   Ip addr");
        for (auto & [ cid, client ] : state.clients) {
            ImGui::Text("%3d : %s", cid, client.ip.c_str());
            if (client.hasControl) {
                ImGui::SameLine();
                ImGui::TextDisabled(" [has control for %4.2f seconds]", state.tControlNext_s - ImGui::GetTime());
            }
        }
        ImGui::End();

        // generate ImDrawData
        ImGui::Render();

        // store ImDrawData for asynchronous dispatching to WS clients
        imguiWS.setDrawData(ImGui::GetDrawData());

        // if not clients are connected, just sleep to save CPU
        do {
            vsync.wait();
        } while (imguiWS.nConnected() == 0);
    }

    ImGui::DestroyContext();

    return 0;
}